

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O1

int SensorBase::detect_sensor(string *type)

{
  size_type sVar1;
  int iVar2;
  path *ppVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  string es;
  path name_path;
  path sysfsbasepath;
  int local_10c;
  directory_iterator local_108;
  directory_iterator local_f8;
  long *local_e8;
  ulong local_e0;
  long local_d8 [2];
  path local_c8;
  string local_a0;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::path<char[32],std::filesystem::__cxx11::path>
            (&local_80,(char (*) [32])"/sys/bus/iio/devices/iio:device",auto_format);
  ppVar3 = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(&local_58,ppVar3);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_f8,&local_58,none,(error_code *)0x0);
  if (local_f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
  }
  local_108._M_dir._M_ptr = local_f8._M_dir._M_ptr;
  local_108._M_dir._M_refcount._M_pi = local_f8._M_dir._M_refcount._M_pi;
  if (local_f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    if (local_f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8._M_dir._M_refcount._M_pi);
    }
  }
  while (local_108._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
  {
    ppVar3 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_108);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_c8,(char (*) [5])"name",auto_format);
    std::filesystem::__cxx11::operator/(&local_80,ppVar3,&local_c8);
    std::filesystem::__cxx11::path::~path(&local_c8);
    readstr_abi_cxx11_(&local_a0,local_80._M_pathname._M_dataplus._M_p,0x100);
    trim(&local_c8._M_pathname,&local_a0);
    if (local_c8._M_pathname._M_string_length == type->_M_string_length) {
      if (local_c8._M_pathname._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = bcmp(local_c8._M_pathname._M_dataplus._M_p,(type->_M_dataplus)._M_p,
                     local_c8._M_pathname._M_string_length);
        bVar6 = iVar2 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_pathname._M_dataplus._M_p != &local_c8._M_pathname.field_2) {
      operator_delete(local_c8._M_pathname._M_dataplus._M_p,
                      local_c8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      sVar1 = (ppVar3->_M_pathname)._M_string_length;
      if (sVar1 == 0) {
LAB_0010d707:
        std::filesystem::__cxx11::path::path(&local_c8);
      }
      else {
        uVar5 = *(ulong *)&ppVar3->_M_cmpts;
        if ((~(byte)uVar5 & 3) != 0) {
          if (((uVar5 & 3) == 0) && ((ppVar3->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
            if ((uVar5 & 3) == 0) {
              lVar4 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar4 = 0;
            }
            if (((byte)ppVar3->_M_cmpts & 3) == 0) {
              ppVar3 = (path *)(lVar4 + -0x30);
            }
            if ((~*(uint *)&ppVar3->_M_cmpts & 3) == 0) goto LAB_0010d6fa;
          }
          goto LAB_0010d707;
        }
LAB_0010d6fa:
        std::filesystem::__cxx11::path::path(&local_c8,ppVar3);
      }
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,local_c8._M_pathname._M_dataplus._M_p,
                 local_c8._M_pathname._M_dataplus._M_p + local_c8._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_c8);
      local_10c = -1;
      bVar7 = local_e0 != 0;
      if (bVar7) {
        if ((byte)((char)*local_e8 - 0x3aU) < 0xf6) {
          uVar5 = 0;
          do {
            if (local_e0 - 1 == uVar5) goto LAB_0010d798;
            lVar4 = uVar5 + 1;
            uVar5 = uVar5 + 1;
          } while ((byte)(*(char *)((long)local_e8 + lVar4) - 0x3aU) < 0xf6);
          bVar7 = uVar5 < local_e0;
        }
        else {
          uVar5 = 0;
        }
        if (bVar7) {
          local_10c = atoi((char *)((long)local_e8 + uVar5));
        }
      }
LAB_0010d798:
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
    }
    std::filesystem::__cxx11::path::~path(&local_80);
    if (bVar6) goto LAB_0010d7db;
    std::filesystem::__cxx11::directory_iterator::operator++(&local_108);
  }
  local_10c = -1;
LAB_0010d7db:
  if (local_108._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108._M_dir._M_refcount._M_pi);
  }
  if (local_f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_dir._M_refcount._M_pi)
    ;
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return local_10c;
}

Assistant:

int SensorBase::detect_sensor(std::string type)
{
	using filesystem::path;
	path sysfsbasepath=path(IIODEV_SYSFS_PATH_BASE).remove_filename();
	for(auto& ent:filesystem::directory_iterator(sysfsbasepath))
	{
		path name_path=ent.path()/"name";
		if(trim(readstr(name_path.c_str()))==type)
		{
			std::string es=ent.path().filename().string();
			size_t i;
			for(i=0;i<es.length()&&(es[i]<'0'||es[i]>'9');++i);
			if(i<es.length())return atoi(es.c_str()+i);
			return -1;
		}
	}
	return -1;
}